

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors2Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,bool raii)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  unsigned_long uVar1;
  _Base_ptr p_Var2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_01;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_00;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_01;
  _Base_ptr p_Var3;
  bool bVar4;
  int iVar5;
  long lVar6;
  undefined4 uVar7;
  undefined7 in_register_00000089;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_02;
  undefined8 uVar8;
  size_t in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeb0;
  allocator_type local_14c;
  Flags<CommandFlavourFlagBits> local_14b;
  undefined2 local_14a;
  undefined1 in_stack_fffffffffffffebc;
  Flags<CommandFlavourFlagBits> FVar9;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffebf;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffec0;
  pointer puVar12;
  _Base_ptr p_Var13;
  undefined1 uVar14;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
  *in_stack_fffffffffffffed0;
  pointer local_120;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_118;
  string *local_100;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_60;
  size_t sVar15;
  
  uVar7 = (undefined4)CONCAT71(in_register_00000089,definition);
  params = &commandData->params;
  local_100 = name;
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&(commandData->params).
                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(returnParams->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start].type.type,"size_t");
  puVar12 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (iVar5 == 0) {
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&(params->
                        super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                        )._M_impl.super__Vector_impl_data._M_start[puVar12[1]].type.type,"void");
    if (iVar5 != 0) goto LAB_001664f8;
    determineVectorParams(&vectorParams,this,params);
    if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,returnParams);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::_Rb_tree(&local_60,&vectorParams._M_t);
      FVar9.m_mask = '\x01';
      __l._M_len = 1;
      __l._M_array = (iterator)&stack0xfffffffffffffebd;
      sVar15 = initialSkipCount;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&local_118,__l,(allocator_type *)&local_14a);
      uVar14 = (undefined1)sVar15;
      local_14b.m_mask = '\x01';
      uVar8 = 0x166441;
      __l_00._M_len = 1;
      __l_00._M_array = &local_14b;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              *)&stack0xfffffffffffffed0,__l_00,&local_14c);
      returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_60;
      returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_c0;
      returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)&stack0xfffffffffffffed0;
      vectorParams_00._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&local_118));
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar8;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffea8;
      generateCommandSetInclusive
                (__return_storage_ptr__,this,local_100,commandData,initialSkipCount,SUB41(uVar7,0),
                 returnParams_00,vectorParams_00,(bool)in_stack_fffffffffffffeb0,
                 (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)CONCAT17(in_stack_fffffffffffffebf,
                             CONCAT16(in_stack_fffffffffffffebe,
                                      CONCAT15(FVar9.m_mask,
                                               CONCAT14(in_stack_fffffffffffffebc,uVar7)))),
                 (bool)in_stack_fffffffffffffec0,(bool)uVar14,in_stack_fffffffffffffed0);
      if (in_stack_fffffffffffffed0 !=
          (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> *)
          0x0) {
        operator_delete(in_stack_fffffffffffffed0,(long)local_120 - (long)in_stack_fffffffffffffed0)
        ;
      }
      if (local_118.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~_Rb_tree(&local_60);
      if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
LAB_001664e2:
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~_Rb_tree(&vectorParams._M_t);
      return __return_storage_ptr__;
    }
  }
  else {
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&(params->
                        super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                        )._M_impl.super__Vector_impl_data._M_start[*puVar12].type.type,"void");
    if ((((iVar5 == 0) ||
         (bVar4 = isHandleType(this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*(returnParams->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start].type.type), bVar4
         )) || (bVar4 = isStructureChainAnchor
                                  (this,&(params->
                                         super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                         )._M_impl.super__Vector_impl_data._M_start
                                         [*(returnParams->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data._M_start].type.type),
               bVar4)) ||
       (((iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&(params->
                           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                           )._M_impl.super__Vector_impl_data._M_start
                           [(returnParams->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start[1]].type.type,"void"),
         iVar5 == 0 ||
         (bVar4 = isHandleType(this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [(returnParams->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start[1]].type.type),
         bVar4)) ||
        (bVar4 = isStructureChainAnchor
                           (this,&(params->
                                  super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                  )._M_impl.super__Vector_impl_data._M_start
                                  [(returnParams->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start[1]].type.type), bVar4)
        ))) goto LAB_001664f8;
    determineVectorParams(&vectorParams,this,params);
    if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 2) {
      puVar12 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar1 = *puVar12;
      lVar6 = std::_Rb_tree_increment
                        (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      if ((uVar1 == *(unsigned_long *)(lVar6 + 0x20)) &&
         (bVar4 = std::
                  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  ::contains(&vectorParams,puVar12 + 1),
         p_Var3 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left, !bVar4)) {
        p_Var13 = (_Base_ptr)
                  (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start[1];
        p_Var2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
        if ((p_Var13 == p_Var2) ||
           (lVar6 = std::_Rb_tree_increment
                              (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left),
           p_Var13 == *(_Base_ptr *)(lVar6 + 0x28))) {
          __assert_fail("( returnParams[1] != vectorParams.begin()->second.lenParam ) && ( returnParams[1] != std::next( vectorParams.begin() )->second.lenParam )"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x112b,
                        "std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors2Return(const std::string &, const CommandData &, size_t, bool, const std::vector<size_t> &, bool) const"
                       );
        }
        lVar6 = std::_Rb_tree_increment(p_Var3);
        uVar14 = SUB81(p_Var13,0);
        if ((((p_Var2 == *(_Base_ptr *)(lVar6 + 0x28)) &&
             (bVar4 = TypeInfo::isValue(&(params->
                                         super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                         )._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].
                                         type), bVar4)) &&
            (bVar4 = isStructureType(this,&(params->
                                           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                           )._M_impl.super__Vector_impl_data._M_start
                                           [*(long *)(vectorParams._M_t._M_impl.
                                                      super__Rb_tree_header._M_header._M_left + 1)].
                                           type.type), bVar4)) &&
           (bVar4 = isStructureChainAnchor
                              (this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*(long *)(vectorParams._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_left + 1)].type.type), !bVar4)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a8,returnParams)
          ;
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_90,&vectorParams._M_t);
          FVar9.m_mask = '\x01';
          uVar10 = 0x10;
          uVar11 = 4;
          __l_01._M_len = 3;
          __l_01._M_array = (iterator)&stack0xfffffffffffffebd;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&local_118,__l_01,(allocator_type *)&local_14b);
          local_14a = 0x401;
          uVar8 = 0x166591;
          __l_02._M_len = 2;
          __l_02._M_array = (iterator)&local_14a;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffed0,__l_02,&local_14c);
          returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_90;
          returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_a8;
          returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&stack0xfffffffffffffed0;
          vectorParams_01._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&local_118));
          vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar8;
          vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count =
               in_stack_fffffffffffffea8;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,local_100,commandData,initialSkipCount,
                     SUB41(uVar7,0),returnParams_01,vectorParams_01,(bool)in_stack_fffffffffffffeb0,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(FVar9.m_mask,
                                                                 CONCAT14(in_stack_fffffffffffffebc,
                                                                          uVar7)))),(bool)uVar14,
                     SUB81(initialSkipCount,0),in_stack_fffffffffffffed0);
          if (in_stack_fffffffffffffed0 !=
              (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
               *)0x0) {
            operator_delete(in_stack_fffffffffffffed0,
                            (long)local_120 - (long)in_stack_fffffffffffffed0);
          }
          if (local_118.
              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_118.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_90);
          if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_001664e2;
        }
      }
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~_Rb_tree(&vectorParams._M_t);
LAB_001664f8:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors2Return( std::string const &         name,
                                                                                     CommandData const &         commandData,
                                                                                     size_t                      initialSkipCount,
                                                                                     bool                        definition,
                                                                                     std::vector<size_t> const & returnParams,
                                                                                     bool                        raii ) const
{
  if ( commandData.params[returnParams[0]].type.type == "size_t" )
  {
    if ( commandData.params[returnParams[1]].type.type == "void" )
    {
      std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
      if ( vectorParams.size() == 1 )
      {
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            returnParams,
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      }
    }
  }
  else if ( ( commandData.params[returnParams[0]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[0]].type.type ) &&
            !isStructureChainAnchor( commandData.params[returnParams[0]].type.type ) )
  {
    if ( ( commandData.params[returnParams[1]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[1]].type.type ) &&
         !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
    {
      std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
      if ( vectorParams.size() == 2 )
      {
        if ( returnParams[0] == std::next( vectorParams.begin() )->first )
        {
          if ( !vectorParams.contains( returnParams[1] ) )
          {
            assert( ( returnParams[1] != vectorParams.begin()->second.lenParam ) && ( returnParams[1] != std::next( vectorParams.begin() )->second.lenParam ) );
            if ( vectorParams.begin()->second.lenParam == std::next( vectorParams.begin() )->second.lenParam )
            {
              if ( commandData.params[vectorParams.begin()->second.lenParam].type.isValue() )
              {
                if ( isStructureType( commandData.params[vectorParams.begin()->first].type.type ) &&
                     !isStructureChainAnchor( commandData.params[vectorParams.begin()->first].type.type ) )
                {
                  return generateCommandSetInclusive(
                    name,
                    commandData,
                    initialSkipCount,
                    definition,
                    returnParams,
                    vectorParams,
                    false,
                    { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator, CommandFlavourFlagBits::singular },
                    raii,
                    false,
                    { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::singular } );
                }
              }
            }
          }
        }
      }
    }
  }
  return "";
}